

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  ImVec2 local_4c;
  ImVec2 local_44;
  float local_3c;
  float local_38;
  float target_y;
  float cr_y;
  float decoration_up_height;
  float target_x;
  float cr_x;
  ImGuiContext *g;
  ImGuiWindow *pIStack_18;
  bool snap_on_edges_local;
  ImGuiWindow *window_local;
  ImVec2 scroll;
  
  _target_x = GImGui;
  window_local = *(ImGuiWindow **)&window->Scroll;
  if ((window->ScrollTarget).x <= 3.4028235e+38 && (window->ScrollTarget).x != 3.4028235e+38) {
    decoration_up_height = (window->ScrollTargetCenterRatio).x;
    cr_y = (window->ScrollTarget).x;
    if (((!snap_on_edges) || (0.0 < decoration_up_height)) || ((window->WindowPadding).x < cr_y)) {
      if (((snap_on_edges) && (1.0 <= decoration_up_height)) &&
         ((window->ContentSize).x + (window->WindowPadding).x + (GImGui->Style).ItemSpacing.x <=
          cr_y)) {
        fVar2 = (window->WindowPadding).x;
        cr_y = fVar2 + fVar2 + (window->ContentSize).x;
      }
    }
    else {
      cr_y = 0.0;
    }
    window_local = (ImGuiWindow *)
                   CONCAT44(window_local._4_4_,
                            -decoration_up_height *
                            ((window->SizeFull).x - (window->ScrollbarSizes).x) + cr_y);
  }
  pfVar1 = &(window->ScrollTarget).y;
  g._7_1_ = snap_on_edges;
  pIStack_18 = window;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar2 = ImGuiWindow::TitleBarHeight(window);
    fVar3 = ImGuiWindow::MenuBarHeight(pIStack_18);
    target_y = fVar2 + fVar3;
    local_38 = (pIStack_18->ScrollTargetCenterRatio).y;
    local_3c = (pIStack_18->ScrollTarget).y;
    if ((((g._7_1_ & 1) != 0) && (local_38 <= 0.0)) && (local_3c <= (pIStack_18->WindowPadding).y))
    {
      local_3c = 0.0;
    }
    if ((((g._7_1_ & 1) != 0) && (1.0 <= local_38)) &&
       ((pIStack_18->ContentSize).y + (pIStack_18->WindowPadding).y +
        (_target_x->Style).ItemSpacing.y <= local_3c)) {
      fVar2 = (pIStack_18->WindowPadding).y;
      local_3c = fVar2 + fVar2 + (pIStack_18->ContentSize).y;
    }
    window_local = (ImGuiWindow *)
                   CONCAT44(-local_38 *
                            (((pIStack_18->SizeFull).y - (pIStack_18->ScrollbarSizes).y) - target_y)
                            + local_3c,window_local._0_4_);
  }
  ImVec2::ImVec2(&local_4c,0.0,0.0);
  local_44 = ImMax((ImVec2 *)&window_local,&local_4c);
  window_local = (ImGuiWindow *)local_44;
  if (((pIStack_18->Collapsed & 1U) == 0) && ((pIStack_18->SkipItems & 1U) == 0)) {
    window_local._0_4_ = local_44.x;
    fVar2 = window_local._0_4_;
    fVar2 = ImMin<float>(fVar2,(pIStack_18->ScrollMax).x);
    window_local = (ImGuiWindow *)CONCAT44(window_local._4_4_,fVar2);
    fVar2 = ImMin<float>(window_local._4_4_,(pIStack_18->ScrollMax).y);
    window_local = (ImGuiWindow *)CONCAT44(fVar2,window_local._0_4_);
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        float target_x = window->ScrollTarget.x;
        if (snap_on_edges && cr_x <= 0.0f && target_x <= window->WindowPadding.x)
            target_x = 0.0f;
        else if (snap_on_edges && cr_x >= 1.0f && target_x >= window->ContentSize.x + window->WindowPadding.x + g.Style.ItemSpacing.x)
            target_x = window->ContentSize.x + window->WindowPadding.x * 2.0f;
        scroll.x = target_x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->ContentSize.y + window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->ContentSize.y + window->WindowPadding.y * 2.0f;
        scroll.y = target_y - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}